

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

int set_add(void *av,void *t)

{
  uint uVar1;
  void **__ptr;
  uint uVar2;
  void *pvVar4;
  int iVar5;
  bool bVar6;
  AbstractVec vv;
  ulong uVar3;
  
  do {
    uVar1 = *av;
    if (uVar1 == 0) {
      vv.v = (void **)0x0;
      *(undefined4 *)((long)av + 4) = 2;
      uVar3 = 2;
    }
    else {
      vv.v = *(void ***)((long)av + 8);
      iVar5 = 5;
      uVar3 = (ulong)t & 0xffffffff;
      while( true ) {
        uVar3 = uVar3 % (ulong)uVar1;
        bVar6 = iVar5 == 0;
        iVar5 = iVar5 + -1;
        if (bVar6) break;
        if (vv.v[uVar3] == (void *)0x0) {
          vv.v[uVar3] = t;
          return 1;
        }
        if (vv.v[uVar3] == t) {
          return 0;
        }
        uVar3 = (ulong)((int)uVar3 + 1);
      }
      uVar2 = *(int *)((long)av + 4) + 1;
      uVar3 = (ulong)uVar2;
      *(uint *)((long)av + 4) = uVar2;
      vv.n = uVar1;
    }
    __ptr = vv.v;
    uVar1 = d_prime2[uVar3];
    *(uint *)av = uVar1;
    pvVar4 = calloc(1,(ulong)uVar1 << 3);
    *(void **)((long)av + 8) = pvVar4;
    if (__ptr != (void **)0x0) {
      set_union(av,&vv);
      free(__ptr);
    }
  } while( true );
}

Assistant:

int set_add(void *av, void *t) {
  AbstractVec *v = (AbstractVec *)av, vv;
  int j, n = v->n;
  uint i;
  if (n) {
    uint h = ((uintptr_t)t);
    h = h % n;
    for (i = h, j = 0; i < v->n && j < SET_MAX_SEQUENTIAL; i = ((i + 1) % n), j++) {
      if (!v->v[i]) {
        v->v[i] = t;
        return 1;
      } else if (v->v[i] == t)
        return 0;
    }
  }
  if (!n) {
    vv.v = NULL;
    v->i = INITIAL_SET_SIZE_INDEX;
  } else {
    vv.v = v->v;
    vv.n = v->n;
    v->i = v->i + 1;
  }
  v->n = d_prime2[v->i];
  v->v = (void **)MALLOC(v->n * sizeof(void *));
  memset(v->v, 0, v->n * sizeof(void *));
  if (vv.v) {
    set_union(av, &vv);
    FREE(vv.v);
  }
  return set_add(v, t);
}